

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

int av1_encode_strategy(AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size,uint *frame_flags,
                       int64_t *time_stamp,int64_t *time_end,aom_rational64_t *timestamp_ratio,
                       int *pop_lookahead,int flush)

{
  FRAME_UPDATE_TYPE FVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  lookahead_entry *plVar6;
  SPEED_FEATURES *sf;
  long *in_RSI;
  AV1_COMP *in_RDI;
  uint *in_R8;
  int64_t *in_R9;
  int64_t *in_stack_00000008;
  aom_rational64_t *in_stack_00000010;
  undefined4 *in_stack_00000018;
  int in_stack_00000020;
  FeatureFlags *features;
  int is_intra_frame;
  int frame_order;
  RefCntBuffer *buf;
  int frame;
  RefCntBuffer *ref_frame;
  int i_2;
  _Bool has_ref_frames;
  uint i_1;
  int get_ref_frames;
  int cur_frame_disp;
  int order_offset;
  RefFrameMapPair ref_frame_map_pairs [8];
  YV12_BUFFER_CONFIG *ref_frame_buf [7];
  int force_refresh_all;
  int kf_requested;
  FRAME_UPDATE_TYPE frame_update_type;
  int64_t pts64;
  lookahead_entry *last_source;
  lookahead_entry *source;
  int idx;
  int cur_disp_idx;
  int i;
  int use_one_pass_rt_params;
  TplParams *tpl_data;
  int pop_size;
  int srcbuf_size;
  size_t frame_size;
  EncodeFrameParams frame_params;
  EncodeFrameInput frame_input;
  GFConfig *gf_cfg;
  ExternalFlags *ext_flags;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  AV1EncoderConfig *oxcf;
  FeatureFlags *in_stack_00000298;
  AV1_COMP *in_stack_000002a0;
  undefined7 in_stack_fffffffffffffde8;
  MV_REFERENCE_FRAME in_stack_fffffffffffffdef;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  undefined1 uVar7;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffe00;
  undefined6 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0e;
  byte bVar8;
  undefined1 in_stack_fffffffffffffe0f;
  AV1_COMP *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  RefFrameMapPair *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  aom_film_grain_table_t *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  AV1_COMP *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  uint uVar9;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffeac;
  AV1_COMP *in_stack_fffffffffffffeb0;
  size_t *in_stack_fffffffffffffeb8;
  EncodeFrameParams *in_stack_fffffffffffffec0;
  EncodeFrameInput *in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  uint8_t *in_stack_fffffffffffffed8;
  AV1_COMP *in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar10;
  char cVar11;
  int64_t in_stack_fffffffffffffef8;
  AV1_COMP *pAVar12;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int local_e8;
  EncodeFrameParams local_c4;
  EncodeFrameInput local_78;
  GFConfig *local_60;
  ExternalFlags *local_58;
  GF_GROUP *local_50;
  AV1_COMMON *local_48;
  AV1EncoderConfig *local_40;
  int64_t *local_38;
  uint *local_30;
  long *local_18;
  AV1_COMP *local_10;
  int local_4;
  
  local_40 = &in_RDI->oxcf;
  local_48 = &in_RDI->common;
  local_50 = &in_RDI->ppi->gf_group;
  local_58 = &in_RDI->ext_flags;
  local_60 = &(in_RDI->oxcf).gf_cfg;
  local_38 = in_R9;
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_78,0,0x18);
  memset(&local_c4,0,0x4c);
  if (in_stack_00000020 == 0) {
    uVar2 = av1_lookahead_depth(local_10->ppi->lookahead,local_10->compressor_stage);
    iVar3 = av1_lookahead_pop_sz(local_10->ppi->lookahead,local_10->compressor_stage);
    if ((int)uVar2 < iVar3) {
      return -1;
    }
  }
  plVar6 = av1_lookahead_peek(local_10->ppi->lookahead,0,local_10->compressor_stage);
  if (plVar6 == (lookahead_entry *)0x0) {
    if (((in_stack_00000020 != 0) && (local_40->pass == AOM_RC_FIRST_PASS)) &&
       ((local_10->ppi->twopass).first_pass_done == 0)) {
      av1_end_first_pass((AV1_COMP *)0x70e0ab);
      (local_10->ppi->twopass).first_pass_done = 1;
    }
    local_4 = -1;
  }
  else {
    iVar3 = has_no_stats_stage(local_10);
    if (iVar3 != 0) {
      if (local_60->gf_max_pyr_height < 1) {
        in_stack_fffffffffffffe24 = local_60->gf_max_pyr_height;
      }
      else {
        in_stack_fffffffffffffe24 = 1;
      }
      local_60->gf_max_pyr_height = in_stack_fffffffffffffe24;
      if (local_60->gf_min_pyr_height < local_60->gf_max_pyr_height) {
        in_stack_fffffffffffffe20 = local_60->gf_min_pyr_height;
      }
      else {
        in_stack_fffffffffffffe20 = local_60->gf_max_pyr_height;
      }
      local_60->gf_min_pyr_height = in_stack_fffffffffffffe20;
    }
    alloc_mb_mode_info_buffers
              ((AV1_COMP *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    local_10->skip_tpl_setup_stats = 0;
    if ((local_40->pass != AOM_RC_FIRST_PASS) &&
       ((local_10->ppi->tpl_data).tpl_stats_pool[0] == (TplDepStats *)0x0)) {
      av1_setup_tpl_buffers
                ((AV1_PRIMARY *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (CommonModeInfoParams *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
    }
    (local_10->twopass_frame).this_frame = (FIRSTPASS_STATS *)0x0;
    iVar3 = is_one_pass_rt_params
                      ((AV1_COMP *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    if ((iVar3 == 0) && (iVar4 = is_stat_generation_stage(local_10), iVar4 == 0)) {
      if (0 < (local_10->ppi->gf_group).frame_parallel_level[local_10->gf_frame_index]) {
        for (local_e8 = 0; local_e8 < 4; local_e8 = local_e8 + 1) {
          (local_10->rc).frame_level_rate_correction_factors[local_e8] =
               (local_10->ppi->p_rc).rate_correction_factors[local_e8];
        }
      }
      memcpy(&local_10->mv_stats,&local_10->ppi->mv_stats,0x4c);
      av1_get_second_pass_params((AV1_COMP *)ref_frame_map_pairs[0],_cur_frame_disp,get_ref_frames);
    }
    iVar4 = is_stat_generation_stage(local_10);
    if (iVar4 == 0) {
      if ((local_50->update_type[local_10->gf_frame_index] == '\x04') &&
         (local_50->refbuf_state[local_10->gf_frame_index] == '\0')) {
        local_c4.show_existing_frame = 1;
      }
      else {
        if ((local_10->ppi->show_existing_alt_ref == 0) ||
           (in_stack_fffffffffffffe1f = true,
           local_50->update_type[local_10->gf_frame_index] != '\x04')) {
          in_stack_fffffffffffffe1f = local_50->update_type[local_10->gf_frame_index] == '\x05';
        }
        local_c4.show_existing_frame = (int)(byte)in_stack_fffffffffffffe1f;
      }
      uVar2 = allow_show_existing((AV1_COMP *)
                                  CONCAT17(in_stack_fffffffffffffe0f,
                                           CONCAT16(in_stack_fffffffffffffe0e,
                                                    in_stack_fffffffffffffe08)),
                                  (uint)((ulong)in_stack_fffffffffffffe00 >> 0x20));
      local_c4.show_existing_frame = uVar2 & local_c4.show_existing_frame;
      if (((local_40->rc_cfg).drop_frames_water_mark != 0) &&
         ((local_50->update_type[local_10->gf_frame_index] == '\x04' ||
          (local_50->update_type[local_10->gf_frame_index] == '\x05')))) {
        in_stack_ffffffffffffff14 = local_50->display_idx[local_10->gf_frame_index];
        for (in_stack_ffffffffffffff10 = 0;
            in_stack_ffffffffffffff10 < (int)(uint)local_10->gf_frame_index;
            in_stack_ffffffffffffff10 = in_stack_ffffffffffffff10 + 1) {
          if (in_stack_ffffffffffffff14 == local_50->display_idx[in_stack_ffffffffffffff10]) {
            if ((local_50->is_frame_dropped[in_stack_ffffffffffffff10] & 1U) != 0) {
              local_c4.show_existing_frame = 0;
              local_10->is_dropped_frame = true;
            }
            break;
          }
        }
      }
      if (local_50->update_type[local_10->gf_frame_index] == '\x04') {
        local_10->ppi->show_existing_alt_ref = 0;
      }
    }
    else {
      local_c4.show_existing_frame = 0;
    }
    pAVar12 = (AV1_COMP *)0x0;
    if (local_c4.show_existing_frame == 0) {
      plVar6 = choose_frame_source((AV1_COMP *)
                                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                                   (int *)CONCAT17(in_stack_fffffffffffffe1f,
                                                   in_stack_fffffffffffffe18),
                                   (int *)in_stack_fffffffffffffe10,
                                   (lookahead_entry **)
                                   CONCAT17(in_stack_fffffffffffffe0f,
                                            CONCAT16(in_stack_fffffffffffffe0e,
                                                     in_stack_fffffffffffffe08)),
                                   (int *)in_stack_fffffffffffffe00);
    }
    else {
      plVar6 = av1_lookahead_peek(local_10->ppi->lookahead,0,local_10->compressor_stage);
      *in_stack_00000018 = 1;
      local_c4.show_frame = 1;
    }
    if (plVar6 == (lookahead_entry *)0x0) {
      if (((in_stack_00000020 != 0) && (local_40->pass == AOM_RC_FIRST_PASS)) &&
         ((local_10->ppi->twopass).first_pass_done == 0)) {
        av1_end_first_pass((AV1_COMP *)0x70e65f);
        (local_10->ppi->twopass).first_pass_done = 1;
      }
      local_4 = -1;
    }
    else {
      local_50->src_offset[local_10->gf_frame_index] = 0;
      local_78.source = &plVar6->img;
      if (((local_10->ppi->use_svc == 0) && ((local_10->rc).prev_frame_is_dropped == 0)) ||
         (pAVar12 == (AV1_COMP *)0x0)) {
        in_stack_fffffffffffffe10 = pAVar12;
        local_78.last_source = (YV12_BUFFER_CONFIG *)pAVar12;
        if (pAVar12 == (AV1_COMP *)0x0) {
          in_stack_fffffffffffffe10 = (AV1_COMP *)0x0;
          local_78.last_source = (YV12_BUFFER_CONFIG *)(AV1_COMP *)0x0;
        }
      }
      else {
        av1_svc_set_last_source(local_10,&local_78,(YV12_BUFFER_CONFIG *)pAVar12);
      }
      local_78.ts_duration = plVar6->ts_end - plVar6->ts_start;
      local_10->unfiltered_source = local_78.source;
      *local_38 = plVar6->ts_start;
      *in_stack_00000008 = plVar6->ts_end;
      if (plVar6->ts_start < (local_10->time_stamps).first_ts_start) {
        (local_10->time_stamps).first_ts_start = plVar6->ts_start;
        (local_10->time_stamps).prev_ts_end = plVar6->ts_start;
      }
      av1_apply_encoding_flags
                (in_stack_fffffffffffffe10,
                 CONCAT17(in_stack_fffffffffffffe0f,
                          CONCAT16(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08)));
      *local_30 = (uint)((plVar6->flags & 1U) != 0);
      if (local_c4.show_frame != 0) {
        adjust_frame_rate((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          (int64_t)in_stack_fffffffffffffe38,
                          CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      }
      iVar4 = (int)((ulong)plVar6 >> 0x20);
      if (local_c4.show_existing_frame == 0) {
        if (local_10->film_grain_table == (aom_film_grain_table_t *)0x0) {
          local_48->cur_frame->film_grain_params_present =
               local_48->seq_params->film_grain_params_present;
        }
        else {
          iVar5 = aom_film_grain_table_lookup
                            (in_stack_fffffffffffffe38,
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                             (int64_t)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                             (aom_film_grain_t *)
                             CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
          local_48->cur_frame->film_grain_params_present = (uint8_t)iVar5;
        }
        in_stack_fffffffffffffef8 = ticks_to_timebase_units(in_stack_00000010,*local_38);
        if ((in_stack_fffffffffffffef8 < 0) || (0xffffffff < in_stack_fffffffffffffef8)) {
          return 1;
        }
        local_48->frame_presentation_time = (uint32_t)in_stack_fffffffffffffef8;
      }
      if (iVar3 != 0) {
        av1_get_one_pass_rt_params
                  ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (FRAME_TYPE *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                   (EncodeFrameInput *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                   ,(uint)((ulong)in_stack_fffffffffffffe48 >> 0x20));
        iVar5 = use_rtc_reference_structure_one_layer
                          ((AV1_COMP *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0)
                          );
        if (iVar5 != 0) {
          av1_set_rtc_reference_structure_one_layer
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        }
      }
      FVar1 = get_frame_update_type(local_50,(uint)local_10->gf_frame_index);
      uVar10 = CONCAT13(FVar1,(int3)in_stack_fffffffffffffef4);
      if ((local_c4.show_existing_frame != 0) && (local_c4.frame_type != '\0')) {
        local_c4.frame_type = '\x01';
      }
      local_c4.speed = local_40->speed;
      if ((iVar3 == 0) &&
         ((iVar3 = is_stat_generation_stage(local_10), iVar3 != 0 ||
          (iVar3 = has_no_stats_stage(local_10), iVar3 != 0)))) {
        in_stack_fffffffffffffe0f = true;
        if (((local_48->current_frame).frame_number != 0) &&
           (in_stack_fffffffffffffe0f = true, (local_40->kf_cfg).key_freq_max != 0)) {
          in_stack_fffffffffffffe0f = (*local_30 & 1) != 0;
        }
        in_stack_fffffffffffffef0 = (uint)(byte)in_stack_fffffffffffffe0f;
        if (((in_stack_fffffffffffffef0 == 0) ||
            (cVar11 = (char)((uint)uVar10 >> 0x18), cVar11 == '\x04')) || (cVar11 == '\x05')) {
          iVar3 = is_stat_generation_stage(local_10);
          if (iVar3 != 0) {
            local_c4.frame_type = '\x01';
          }
        }
        else {
          local_c4.frame_type = '\0';
        }
      }
      iVar3 = has_no_stats_stage(local_10);
      if ((iVar3 == 0) || ((local_40->q_cfg).aq_mode != '\x03')) {
        iVar3 = is_stat_generation_stage(local_10);
        if (iVar3 == 0) {
          is_stat_consumption_stage
                    ((AV1_COMP *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
        }
        else {
          iVar3 = is_lossless_requested(&local_40->rc_cfg);
          (local_10->td).mb.e_mbd.lossless[0] = iVar3;
        }
      }
      else {
        av1_cyclic_refresh_update_parameters
                  ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      }
      iVar3 = is_stat_generation_stage(local_10);
      if (iVar3 == 0) {
        set_ext_overrides(local_48,&local_c4,local_58);
      }
      if (((local_c4.frame_type == '\0') && (local_c4.show_frame != 0)) ||
         (bVar8 = 0, local_c4.frame_type == '\x03')) {
        bVar8 = local_c4.show_existing_frame != 0U ^ 0xff;
      }
      av1_configure_buffer_updates
                (in_stack_fffffffffffffe10,
                 (RefreshFrameInfo *)
                 CONCAT17(in_stack_fffffffffffffe0f,CONCAT16(bVar8,in_stack_fffffffffffffe08)),
                 (FRAME_UPDATE_TYPE)((ulong)in_stack_fffffffffffffe00 >> 0x38),
                 (REFBUF_STATE)((ulong)in_stack_fffffffffffffe00 >> 0x30),
                 (int)in_stack_fffffffffffffe00);
      iVar3 = is_stat_generation_stage(local_10);
      if (iVar3 == 0) {
        init_ref_map_pair(in_stack_fffffffffffffe10,
                          (RefFrameMapPair *)
                          CONCAT17(in_stack_fffffffffffffe0f,
                                   CONCAT16(bVar8,in_stack_fffffffffffffe08)));
        uVar2 = (local_10->common).current_frame.frame_number +
                (uint)local_50->arf_src_offset[local_10->gf_frame_index];
        if (local_50->frame_parallel_level[local_10->gf_frame_index] == 0) {
          if (((local_58->refresh_frame).update_pending & 1U) == 0) {
            av1_get_ref_frames((RefFrameMapPair *)
                               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar4,
                               pAVar12,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                               (int)in_stack_fffffffffffffef8,
                               (int *)CONCAT44(uVar10,in_stack_fffffffffffffef0));
          }
          else if (((local_10->ppi->rtc_ref).set_ref_frame_config != 0) ||
                  (iVar3 = use_rtc_reference_structure_one_layer
                                     ((AV1_COMP *)
                                      CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0))
                  , iVar3 != 0)) {
            for (uVar9 = 0; uVar9 < 7; uVar9 = uVar9 + 1) {
              local_48->remapped_ref_idx[uVar9] = (local_10->ppi->rtc_ref).ref_idx[uVar9];
            }
          }
        }
        uVar9 = 0;
        for (iVar3 = 0; iVar3 < 7; iVar3 = iVar3 + 1) {
          in_stack_fffffffffffffe48 =
               (AV1_COMP *)
               get_ref_frame_buf((AV1_COMMON *)
                                 CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                                 in_stack_fffffffffffffdef);
          if (in_stack_fffffffffffffe48 == (AV1_COMP *)0x0) {
            in_stack_fffffffffffffe00 = (YV12_BUFFER_CONFIG *)0x0;
          }
          else {
            in_stack_fffffffffffffe00 =
                 (YV12_BUFFER_CONFIG *)
                 ((in_stack_fffffffffffffe48->enc_quant_dequant_params).quants.y_quant + 0x4d);
          }
          *(YV12_BUFFER_CONFIG **)(&stack0xfffffffffffffea8 + (long)iVar3 * 8) =
               in_stack_fffffffffffffe00;
          if (in_stack_fffffffffffffe48 != (AV1_COMP *)0x0) {
            uVar9 = 0x1000000;
          }
        }
        if (((uVar9 & 0x1000000) == 0) &&
           ((local_c4.frame_type == '\x01' || (local_c4.frame_type == '\x03')))) {
          return 1;
        }
        sf = &local_10->sf;
        iVar3 = is_one_pass_rt_params
                          ((AV1_COMP *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0)
                          );
        local_c4.ref_frame_flags =
             get_ref_frame_flags(sf,iVar3,(YV12_BUFFER_CONFIG **)&stack0xfffffffffffffea8,
                                 local_58->ref_frame_flags);
        if (((local_10->ppi->gf_group).is_frame_non_ref[local_10->gf_frame_index] & 1U) == 0) {
          local_c4.primary_ref_frame =
               choose_primary_ref_frame
                         ((AV1_COMP *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                          (EncodeFrameParams *)in_stack_fffffffffffffe10);
        }
        else {
          local_c4.primary_ref_frame = 7;
        }
        local_c4.order_offset = (int)local_50->arf_src_offset[local_10->gf_frame_index];
        if ((local_10->refresh_idx_available & 1U) == 0) {
          local_c4.refresh_frame_flags =
               av1_get_refresh_frame_flags
                         (in_stack_fffffffffffffe48,
                          (EncodeFrameParams *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          (FRAME_UPDATE_TYPE)((ulong)in_stack_fffffffffffffe38 >> 0x38),
                          (int)in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                          in_stack_fffffffffffffe28);
        }
        else {
          local_c4.refresh_frame_flags = 1 << ((byte)local_10->ref_refresh_index & 0x1f);
        }
        if ((local_50->is_frame_non_ref[local_10->gf_frame_index] & 1U) != 0) {
          local_c4.refresh_frame_flags = 0;
        }
        local_c4.existing_fb_idx_to_show = -1;
        if (local_c4.show_existing_frame != 0) {
          for (iVar3 = 0; iVar3 < 8; iVar3 = iVar3 + 1) {
            if ((local_48->ref_frame_map[iVar3] != (RefCntBuffer *)0x0) &&
               (local_48->ref_frame_map[iVar3]->display_order_hint == uVar2)) {
              local_c4.existing_fb_idx_to_show = iVar3;
            }
          }
        }
      }
      local_c4.remapped_ref_idx._0_8_ = *(undefined8 *)local_48->remapped_ref_idx;
      local_c4.remapped_ref_idx._8_8_ = *(undefined8 *)(local_48->remapped_ref_idx + 2);
      local_c4.remapped_ref_idx._16_8_ = *(undefined8 *)(local_48->remapped_ref_idx + 4);
      local_c4.remapped_ref_idx._24_8_ = *(undefined8 *)(local_48->remapped_ref_idx + 6);
      (local_10->td).mb.delta_qindex = 0;
      (local_10->td).mb.rdmult_delta_qindex = 0;
      if (local_c4.show_existing_frame == 0) {
        (local_48->quant_params).using_qmatrix = (_Bool)((local_40->q_cfg).using_qm & 1);
      }
      uVar7 = local_c4.frame_type == '\0' || local_c4.frame_type == '\x02';
      uVar2 = (uint)(byte)uVar7;
      pAVar12 = (AV1_COMP *)&local_48->features;
      iVar3 = is_stat_generation_stage(local_10);
      if ((iVar3 == 0) &&
         (((local_40->pass == AOM_RC_ONE_PASS || (AOM_RC_FIRST_PASS < local_40->pass)) &&
          (uVar2 != 0)))) {
        av1_set_screen_content_options(in_stack_000002a0,in_stack_00000298);
      }
      iVar3 = has_no_stats_stage(local_10);
      if (((iVar3 == 0) || (local_40->mode != '\x01')) || (local_60->lag_in_frames != 0)) {
        iVar3 = denoise_and_encode(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                   in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        iVar4 = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
        if (iVar3 != 0) {
          return 1;
        }
      }
      else {
        iVar3 = av1_encode(pAVar12,(uint8_t *)
                                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                           CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                           (EncodeFrameInput *)in_stack_fffffffffffffe10,
                           (EncodeFrameParams *)
                           CONCAT17(in_stack_fffffffffffffe0f,
                                    CONCAT16(bVar8,in_stack_fffffffffffffe08)),
                           (size_t *)in_stack_fffffffffffffe00);
        iVar4 = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
        if (iVar3 != 0) {
          return 1;
        }
      }
      iVar3 = is_psnr_calc_enabled((AV1_COMP *)CONCAT17(uVar7,in_stack_fffffffffffffdf0));
      if ((iVar3 != 0) && ((local_10->sf).rt_sf.use_rtc_tf != 0)) {
        local_10->source = &local_10->orig_source;
      }
      iVar3 = is_stat_generation_stage(local_10);
      if (iVar3 == 0) {
        update_frame_flags((AV1_COMMON *)CONCAT17(uVar7,in_stack_fffffffffffffdf0),
                           (RefreshFrameInfo *)
                           CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                           (uint *)0x70f2a6);
        set_additional_frame_flags
                  ((AV1_COMMON *)CONCAT17(uVar7,in_stack_fffffffffffffdf0),
                   (uint *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      }
      *local_18 = 0;
      if (*local_18 != 0) {
        iVar3 = is_frame_droppable(&local_10->ppi->rtc_ref,&local_58->refresh_frame);
        local_10->droppable = iVar3;
      }
      if (((*local_18 != 0) &&
          ((((local_10->ppi->use_svc != 0 || (0 < (local_10->oxcf).rc_cfg.drop_frames_water_mark))
            && ((local_10->svc).spatial_layer_id == (local_10->svc).number_spatial_layers + -1)) &&
           (((local_10->svc).temporal_layer_id == 0 &&
            ((local_10->unscaled_source->field_0).field_0.y_width ==
             (local_10->svc).source_last_TL0.field_0.field_0.y_width)))))) &&
         ((local_10->unscaled_source->field_1).field_0.y_height ==
          (local_10->svc).source_last_TL0.field_1.field_0.y_height)) {
        aom_yv12_copy_y_c((YV12_BUFFER_CONFIG *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (YV12_BUFFER_CONFIG *)
                          CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),iVar4);
        aom_yv12_copy_u_c((YV12_BUFFER_CONFIG *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (YV12_BUFFER_CONFIG *)
                          CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),iVar4);
        aom_yv12_copy_v_c((YV12_BUFFER_CONFIG *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (YV12_BUFFER_CONFIG *)
                          CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),iVar4);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int av1_encode_strategy(AV1_COMP *const cpi, size_t *const size,
                        uint8_t *const dest, size_t dest_size,
                        unsigned int *frame_flags, int64_t *const time_stamp,
                        int64_t *const time_end,
                        const aom_rational64_t *const timestamp_ratio,
                        int *const pop_lookahead, int flush) {
  AV1EncoderConfig *const oxcf = &cpi->oxcf;
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  ExternalFlags *const ext_flags = &cpi->ext_flags;
  GFConfig *const gf_cfg = &oxcf->gf_cfg;

  EncodeFrameInput frame_input;
  EncodeFrameParams frame_params;
  size_t frame_size;
  memset(&frame_input, 0, sizeof(frame_input));
  memset(&frame_params, 0, sizeof(frame_params));
  frame_size = 0;

#if CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS
  VBR_RATECTRL_INFO *vbr_rc_info = &cpi->vbr_rc_info;
  if (oxcf->pass == AOM_RC_THIRD_PASS && vbr_rc_info->ready == 0) {
    THIRD_PASS_FRAME_INFO frame_info[MAX_THIRD_PASS_BUF];
    av1_open_second_pass_log(cpi, 1);
    FILE *second_pass_log_stream = cpi->second_pass_log_stream;
    fseek(second_pass_log_stream, 0, SEEK_END);
    size_t file_size = ftell(second_pass_log_stream);
    rewind(second_pass_log_stream);
    size_t read_size = 0;
    while (read_size < file_size) {
      THIRD_PASS_GOP_INFO gop_info;
      struct aom_internal_error_info *error = cpi->common.error;
      // Read in GOP information from the second pass file.
      av1_read_second_pass_gop_info(second_pass_log_stream, &gop_info, error);
      TPL_INFO *tpl_info;
      AOM_CHECK_MEM_ERROR(cm->error, tpl_info, aom_malloc(sizeof(*tpl_info)));
      av1_read_tpl_info(tpl_info, second_pass_log_stream, error);
      // Read in per-frame info from second-pass encoding
      av1_read_second_pass_per_frame_info(second_pass_log_stream, frame_info,
                                          gop_info.num_frames, error);
      av1_vbr_rc_append_tpl_info(vbr_rc_info, tpl_info);
      read_size = ftell(second_pass_log_stream);
      aom_free(tpl_info);
    }
    av1_close_second_pass_log(cpi);
    if (cpi->oxcf.rc_cfg.mode == AOM_Q) {
      vbr_rc_info->base_q_index = cpi->oxcf.rc_cfg.cq_level;
      av1_vbr_rc_compute_q_indices(
          vbr_rc_info->base_q_index, vbr_rc_info->total_frame_count,
          vbr_rc_info->qstep_ratio_list, cm->seq_params->bit_depth,
          vbr_rc_info->q_index_list);
    } else {
      vbr_rc_info->base_q_index = av1_vbr_rc_info_estimate_base_q(
          vbr_rc_info->total_bit_budget, cm->seq_params->bit_depth,
          vbr_rc_info->scale_factors, vbr_rc_info->total_frame_count,
          vbr_rc_info->update_type_list, vbr_rc_info->qstep_ratio_list,
          vbr_rc_info->txfm_stats_list, vbr_rc_info->q_index_list, NULL);
    }
    vbr_rc_info->ready = 1;
#if CONFIG_RATECTRL_LOG
    rc_log_record_chunk_info(&cpi->rc_log, vbr_rc_info->base_q_index,
                             vbr_rc_info->total_frame_count);
#endif  // CONFIG_RATECTRL_LOG
  }
#endif  // CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS

  // Check if we need to stuff more src frames
  if (flush == 0) {
    int srcbuf_size =
        av1_lookahead_depth(cpi->ppi->lookahead, cpi->compressor_stage);
    int pop_size =
        av1_lookahead_pop_sz(cpi->ppi->lookahead, cpi->compressor_stage);

    // Continue buffering look ahead buffer.
    if (srcbuf_size < pop_size) return -1;
  }

  if (!av1_lookahead_peek(cpi->ppi->lookahead, 0, cpi->compressor_stage)) {
#if !CONFIG_REALTIME_ONLY
    if (flush && oxcf->pass == AOM_RC_FIRST_PASS &&
        !cpi->ppi->twopass.first_pass_done) {
      av1_end_first_pass(cpi); /* get last stats packet */
      cpi->ppi->twopass.first_pass_done = 1;
    }
#endif
    return -1;
  }

  // TODO(sarahparker) finish bit allocation for one pass pyramid
  if (has_no_stats_stage(cpi)) {
    gf_cfg->gf_max_pyr_height =
        AOMMIN(gf_cfg->gf_max_pyr_height, USE_ALTREF_FOR_ONE_PASS);
    gf_cfg->gf_min_pyr_height =
        AOMMIN(gf_cfg->gf_min_pyr_height, gf_cfg->gf_max_pyr_height);
  }

  // Allocation of mi buffers.
  alloc_mb_mode_info_buffers(cpi);

  cpi->skip_tpl_setup_stats = 0;
#if !CONFIG_REALTIME_ONLY
  if (oxcf->pass != AOM_RC_FIRST_PASS) {
    TplParams *const tpl_data = &cpi->ppi->tpl_data;
    if (tpl_data->tpl_stats_pool[0] == NULL) {
      av1_setup_tpl_buffers(cpi->ppi, &cm->mi_params, oxcf->frm_dim_cfg.width,
                            oxcf->frm_dim_cfg.height, 0,
                            oxcf->gf_cfg.lag_in_frames);
    }
  }
  cpi->twopass_frame.this_frame = NULL;
  const int use_one_pass_rt_params = is_one_pass_rt_params(cpi);
  if (!use_one_pass_rt_params && !is_stat_generation_stage(cpi)) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_get_second_pass_params_time);
#endif

    // Initialise frame_level_rate_correction_factors with value previous
    // to the parallel frames.
    if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      for (int i = 0; i < RATE_FACTOR_LEVELS; i++) {
        cpi->rc.frame_level_rate_correction_factors[i] =
#if CONFIG_FPMT_TEST
            (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE)
                ? cpi->ppi->p_rc.temp_rate_correction_factors[i]
                :
#endif  // CONFIG_FPMT_TEST
                cpi->ppi->p_rc.rate_correction_factors[i];
      }
    }

    // copy mv_stats from ppi to frame_level cpi.
    cpi->mv_stats = cpi->ppi->mv_stats;
    av1_get_second_pass_params(cpi, &frame_params, *frame_flags);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_get_second_pass_params_time);
#endif
  }
#endif

  if (!is_stat_generation_stage(cpi)) {
    // TODO(jingning): fwd key frame always uses show existing frame?
    if (gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE &&
        gf_group->refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
      frame_params.show_existing_frame = 1;
    } else {
      frame_params.show_existing_frame =
          (cpi->ppi->show_existing_alt_ref &&
           gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE) ||
          gf_group->update_type[cpi->gf_frame_index] == INTNL_OVERLAY_UPDATE;
    }
    frame_params.show_existing_frame &= allow_show_existing(cpi, *frame_flags);

    // Special handling to reset 'show_existing_frame' in case of dropped
    // frames.
    if (oxcf->rc_cfg.drop_frames_water_mark &&
        (gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE ||
         gf_group->update_type[cpi->gf_frame_index] == INTNL_OVERLAY_UPDATE)) {
      // During the encode of an OVERLAY_UPDATE/INTNL_OVERLAY_UPDATE frame, loop
      // over the gf group to check if the corresponding
      // ARF_UPDATE/INTNL_ARF_UPDATE frame was dropped.
      int cur_disp_idx = gf_group->display_idx[cpi->gf_frame_index];
      for (int idx = 0; idx < cpi->gf_frame_index; idx++) {
        if (cur_disp_idx == gf_group->display_idx[idx]) {
          assert(IMPLIES(
              gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE,
              gf_group->update_type[idx] == ARF_UPDATE));
          assert(IMPLIES(gf_group->update_type[cpi->gf_frame_index] ==
                             INTNL_OVERLAY_UPDATE,
                         gf_group->update_type[idx] == INTNL_ARF_UPDATE));
          // Reset show_existing_frame and set cpi->is_dropped_frame to true if
          // the frame was dropped during its first encode.
          if (gf_group->is_frame_dropped[idx]) {
            frame_params.show_existing_frame = 0;
            assert(!cpi->is_dropped_frame);
            cpi->is_dropped_frame = true;
          }
          break;
        }
      }
    }

    // Reset show_existing_alt_ref decision to 0 after it is used.
    if (gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE) {
      cpi->ppi->show_existing_alt_ref = 0;
    }
  } else {
    frame_params.show_existing_frame = 0;
  }

  struct lookahead_entry *source = NULL;
  struct lookahead_entry *last_source = NULL;
  if (frame_params.show_existing_frame) {
    source = av1_lookahead_peek(cpi->ppi->lookahead, 0, cpi->compressor_stage);
    *pop_lookahead = 1;
    frame_params.show_frame = 1;
  } else {
    source = choose_frame_source(cpi, &flush, pop_lookahead, &last_source,
                                 &frame_params.show_frame);
  }

  if (source == NULL) {  // If no source was found, we can't encode a frame.
#if !CONFIG_REALTIME_ONLY
    if (flush && oxcf->pass == AOM_RC_FIRST_PASS &&
        !cpi->ppi->twopass.first_pass_done) {
      av1_end_first_pass(cpi); /* get last stats packet */
      cpi->ppi->twopass.first_pass_done = 1;
    }
#endif
    return -1;
  }

  // reset src_offset to allow actual encode call for this frame to get its
  // source.
  gf_group->src_offset[cpi->gf_frame_index] = 0;

  // Source may be changed if temporal filtered later.
  frame_input.source = &source->img;
  if ((cpi->ppi->use_svc || cpi->rc.prev_frame_is_dropped) &&
      last_source != NULL)
    av1_svc_set_last_source(cpi, &frame_input, &last_source->img);
  else
    frame_input.last_source = last_source != NULL ? &last_source->img : NULL;
  frame_input.ts_duration = source->ts_end - source->ts_start;
  // Save unfiltered source. It is used in av1_get_second_pass_params().
  cpi->unfiltered_source = frame_input.source;

  *time_stamp = source->ts_start;
  *time_end = source->ts_end;
  if (source->ts_start < cpi->time_stamps.first_ts_start) {
    cpi->time_stamps.first_ts_start = source->ts_start;
    cpi->time_stamps.prev_ts_end = source->ts_start;
  }

  av1_apply_encoding_flags(cpi, source->flags);
  *frame_flags = (source->flags & AOM_EFLAG_FORCE_KF) ? FRAMEFLAGS_KEY : 0;

#if CONFIG_FPMT_TEST
  if (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) {
    if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      cpi->framerate = cpi->temp_framerate;
    }
  }
#endif  // CONFIG_FPMT_TEST

  // Shown frames and arf-overlay frames need frame-rate considering
  if (frame_params.show_frame)
    adjust_frame_rate(cpi, source->ts_start, source->ts_end);

  if (!frame_params.show_existing_frame) {
#if !CONFIG_REALTIME_ONLY
    if (cpi->film_grain_table) {
      cm->cur_frame->film_grain_params_present = aom_film_grain_table_lookup(
          cpi->film_grain_table, *time_stamp, *time_end, 0 /* =erase */,
          &cm->film_grain_params);
    } else {
      cm->cur_frame->film_grain_params_present =
          cm->seq_params->film_grain_params_present;
    }
#endif
    // only one operating point supported now
    const int64_t pts64 = ticks_to_timebase_units(timestamp_ratio, *time_stamp);
    if (pts64 < 0 || pts64 > UINT32_MAX) return AOM_CODEC_ERROR;

    cm->frame_presentation_time = (uint32_t)pts64;
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_get_one_pass_rt_params_time);
#endif
#if CONFIG_REALTIME_ONLY
  av1_get_one_pass_rt_params(cpi, &frame_params.frame_type, &frame_input,
                             *frame_flags);
  if (use_rtc_reference_structure_one_layer(cpi))
    av1_set_rtc_reference_structure_one_layer(cpi, cpi->gf_frame_index == 0);
#else
  if (use_one_pass_rt_params) {
    av1_get_one_pass_rt_params(cpi, &frame_params.frame_type, &frame_input,
                               *frame_flags);
    if (use_rtc_reference_structure_one_layer(cpi))
      av1_set_rtc_reference_structure_one_layer(cpi, cpi->gf_frame_index == 0);
  }
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_get_one_pass_rt_params_time);
#endif

  FRAME_UPDATE_TYPE frame_update_type =
      get_frame_update_type(gf_group, cpi->gf_frame_index);

  if (frame_params.show_existing_frame &&
      frame_params.frame_type != KEY_FRAME) {
    // Force show-existing frames to be INTER, except forward keyframes
    frame_params.frame_type = INTER_FRAME;
  }

  // Per-frame encode speed.  In theory this can vary, but things may have
  // been written assuming speed-level will not change within a sequence, so
  // this parameter should be used with caution.
  frame_params.speed = oxcf->speed;

#if !CONFIG_REALTIME_ONLY
  // Set forced key frames when necessary. For two-pass encoding / lap mode,
  // this is already handled by av1_get_second_pass_params. However when no
  // stats are available, we still need to check if the new frame is a keyframe.
  // For one pass rt, this is already checked in av1_get_one_pass_rt_params.
  if (!use_one_pass_rt_params &&
      (is_stat_generation_stage(cpi) || has_no_stats_stage(cpi))) {
    // Current frame is coded as a key-frame for any of the following cases:
    // 1) First frame of a video
    // 2) For all-intra frame encoding
    // 3) When a key-frame is forced
    const int kf_requested =
        (cm->current_frame.frame_number == 0 ||
         oxcf->kf_cfg.key_freq_max == 0 || (*frame_flags & FRAMEFLAGS_KEY));
    if (kf_requested && frame_update_type != OVERLAY_UPDATE &&
        frame_update_type != INTNL_OVERLAY_UPDATE) {
      frame_params.frame_type = KEY_FRAME;
    } else if (is_stat_generation_stage(cpi)) {
      // For stats generation, set the frame type to inter here.
      frame_params.frame_type = INTER_FRAME;
    }
  }
#endif

  // Work out some encoding parameters specific to the pass:
  if (has_no_stats_stage(cpi) && oxcf->q_cfg.aq_mode == CYCLIC_REFRESH_AQ) {
    av1_cyclic_refresh_update_parameters(cpi);
  } else if (is_stat_generation_stage(cpi)) {
    cpi->td.mb.e_mbd.lossless[0] = is_lossless_requested(&oxcf->rc_cfg);
  } else if (is_stat_consumption_stage(cpi)) {
#if CONFIG_MISMATCH_DEBUG
    mismatch_move_frame_idx_w();
#endif
#if TXCOEFF_COST_TIMER
    cm->txcoeff_cost_timer = 0;
    cm->txcoeff_cost_count = 0;
#endif
  }

  if (!is_stat_generation_stage(cpi))
    set_ext_overrides(cm, &frame_params, ext_flags);

  // Shown keyframes and S frames refresh all reference buffers
  const int force_refresh_all =
      ((frame_params.frame_type == KEY_FRAME && frame_params.show_frame) ||
       frame_params.frame_type == S_FRAME) &&
      !frame_params.show_existing_frame;

  av1_configure_buffer_updates(
      cpi, &frame_params.refresh_frame, frame_update_type,
      gf_group->refbuf_state[cpi->gf_frame_index], force_refresh_all);

  if (!is_stat_generation_stage(cpi)) {
    const YV12_BUFFER_CONFIG *ref_frame_buf[INTER_REFS_PER_FRAME];

    RefFrameMapPair ref_frame_map_pairs[REF_FRAMES];
    init_ref_map_pair(cpi, ref_frame_map_pairs);
    const int order_offset = gf_group->arf_src_offset[cpi->gf_frame_index];
    const int cur_frame_disp =
        cpi->common.current_frame.frame_number + order_offset;

    int get_ref_frames = 0;
#if CONFIG_FPMT_TEST
    get_ref_frames =
        (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 1 : 0;
#endif  // CONFIG_FPMT_TEST
    if (get_ref_frames ||
        gf_group->frame_parallel_level[cpi->gf_frame_index] == 0) {
      if (!ext_flags->refresh_frame.update_pending) {
        av1_get_ref_frames(ref_frame_map_pairs, cur_frame_disp, cpi,
                           cpi->gf_frame_index, 1, cm->remapped_ref_idx);
      } else if (cpi->ppi->rtc_ref.set_ref_frame_config ||
                 use_rtc_reference_structure_one_layer(cpi)) {
        for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++)
          cm->remapped_ref_idx[i] = cpi->ppi->rtc_ref.ref_idx[i];
      }
    }

    // Get the reference frames
    bool has_ref_frames = false;
    for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
      const RefCntBuffer *ref_frame =
          get_ref_frame_buf(cm, ref_frame_priority_order[i]);
      ref_frame_buf[i] = ref_frame != NULL ? &ref_frame->buf : NULL;
      if (ref_frame != NULL) has_ref_frames = true;
    }
    if (!has_ref_frames && (frame_params.frame_type == INTER_FRAME ||
                            frame_params.frame_type == S_FRAME)) {
      return AOM_CODEC_ERROR;
    }

    // Work out which reference frame slots may be used.
    frame_params.ref_frame_flags =
        get_ref_frame_flags(&cpi->sf, is_one_pass_rt_params(cpi), ref_frame_buf,
                            ext_flags->ref_frame_flags);

    // Set primary_ref_frame of non-reference frames as PRIMARY_REF_NONE.
    if (cpi->ppi->gf_group.is_frame_non_ref[cpi->gf_frame_index]) {
      frame_params.primary_ref_frame = PRIMARY_REF_NONE;
    } else {
      frame_params.primary_ref_frame =
          choose_primary_ref_frame(cpi, &frame_params);
    }

    frame_params.order_offset = gf_group->arf_src_offset[cpi->gf_frame_index];

    // Call av1_get_refresh_frame_flags() if refresh index not available.
    if (!cpi->refresh_idx_available) {
      frame_params.refresh_frame_flags = av1_get_refresh_frame_flags(
          cpi, &frame_params, frame_update_type, cpi->gf_frame_index,
          cur_frame_disp, ref_frame_map_pairs);
    } else {
      assert(cpi->ref_refresh_index != INVALID_IDX);
      frame_params.refresh_frame_flags = (1 << cpi->ref_refresh_index);
    }

    // Make the frames marked as is_frame_non_ref to non-reference frames.
    if (gf_group->is_frame_non_ref[cpi->gf_frame_index])
      frame_params.refresh_frame_flags = 0;

    frame_params.existing_fb_idx_to_show = INVALID_IDX;
    // Find the frame buffer to show based on display order.
    if (frame_params.show_existing_frame) {
      for (int frame = 0; frame < REF_FRAMES; frame++) {
        const RefCntBuffer *const buf = cm->ref_frame_map[frame];
        if (buf == NULL) continue;
        const int frame_order = (int)buf->display_order_hint;
        if (frame_order == cur_frame_disp)
          frame_params.existing_fb_idx_to_show = frame;
      }
    }
  }

  // The way frame_params->remapped_ref_idx is setup is a placeholder.
  // Currently, reference buffer assignment is done by update_ref_frame_map()
  // which is called by high-level strategy AFTER encoding a frame.  It
  // modifies cm->remapped_ref_idx.  If you want to use an alternative method
  // to determine reference buffer assignment, just put your assignments into
  // frame_params->remapped_ref_idx here and they will be used when encoding
  // this frame.  If frame_params->remapped_ref_idx is setup independently of
  // cm->remapped_ref_idx then update_ref_frame_map() will have no effect.
  memcpy(frame_params.remapped_ref_idx, cm->remapped_ref_idx,
         REF_FRAMES * sizeof(*cm->remapped_ref_idx));

  cpi->td.mb.rdmult_delta_qindex = cpi->td.mb.delta_qindex = 0;

  if (!frame_params.show_existing_frame) {
    cm->quant_params.using_qmatrix = oxcf->q_cfg.using_qm;
  }

  const int is_intra_frame = frame_params.frame_type == KEY_FRAME ||
                             frame_params.frame_type == INTRA_ONLY_FRAME;
  FeatureFlags *const features = &cm->features;
  if (!is_stat_generation_stage(cpi) &&
      (oxcf->pass == AOM_RC_ONE_PASS || oxcf->pass >= AOM_RC_SECOND_PASS) &&
      is_intra_frame) {
    av1_set_screen_content_options(cpi, features);
  }

#if CONFIG_REALTIME_ONLY
  if (av1_encode(cpi, dest, dest_size, &frame_input, &frame_params,
                 &frame_size) != AOM_CODEC_OK) {
    return AOM_CODEC_ERROR;
  }
#else
  if (has_no_stats_stage(cpi) && oxcf->mode == REALTIME &&
      gf_cfg->lag_in_frames == 0) {
    if (av1_encode(cpi, dest, dest_size, &frame_input, &frame_params,
                   &frame_size) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }
  } else if (denoise_and_encode(cpi, dest, dest_size, &frame_input,
                                &frame_params, &frame_size) != AOM_CODEC_OK) {
    return AOM_CODEC_ERROR;
  }
#endif  // CONFIG_REALTIME_ONLY

  // This is used in rtc temporal filter case. Use true source in the PSNR
  // calculation.
  if (is_psnr_calc_enabled(cpi) && cpi->sf.rt_sf.use_rtc_tf) {
    assert(cpi->orig_source.buffer_alloc_sz > 0);
    cpi->source = &cpi->orig_source;
  }

  if (!is_stat_generation_stage(cpi)) {
    // First pass doesn't modify reference buffer assignment or produce frame
    // flags
    update_frame_flags(&cpi->common, &cpi->refresh_frame, frame_flags);
    set_additional_frame_flags(cm, frame_flags);
  }

#if !CONFIG_REALTIME_ONLY
#if TXCOEFF_COST_TIMER
  if (!is_stat_generation_stage(cpi)) {
    cm->cum_txcoeff_cost_timer += cm->txcoeff_cost_timer;
    fprintf(stderr,
            "\ntxb coeff cost block number: %ld, frame time: %ld, cum time %ld "
            "in us\n",
            cm->txcoeff_cost_count, cm->txcoeff_cost_timer,
            cm->cum_txcoeff_cost_timer);
  }
#endif
#endif  // !CONFIG_REALTIME_ONLY

#if CONFIG_TUNE_VMAF
  if (!is_stat_generation_stage(cpi) &&
      (oxcf->tune_cfg.tuning >= AOM_TUNE_VMAF_WITH_PREPROCESSING &&
       oxcf->tune_cfg.tuning <= AOM_TUNE_VMAF_NEG_MAX_GAIN)) {
    av1_update_vmaf_curve(cpi);
  }
#endif

  *size = frame_size;

  // Leave a signal for a higher level caller about if this frame is droppable
  if (*size > 0) {
    cpi->droppable =
        is_frame_droppable(&cpi->ppi->rtc_ref, &ext_flags->refresh_frame);
  }

  // For SVC, or when frame-dropper is enabled:
  // keep track of the (unscaled) source corresponding to the refresh of LAST
  // reference (base temporal layer - TL0). Copy only for the
  // top spatial enhancement layer so all spatial layers of the next
  // superframe have last_source to be aligned with previous TL0 superframe.
  // Avoid cases where resolution changes for unscaled source (top spatial
  // layer). Only needs to be done for frame that are encoded (size > 0).
  if (*size > 0 &&
      (cpi->ppi->use_svc || cpi->oxcf.rc_cfg.drop_frames_water_mark > 0) &&
      cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1 &&
      cpi->svc.temporal_layer_id == 0 &&
      cpi->unscaled_source->y_width == cpi->svc.source_last_TL0.y_width &&
      cpi->unscaled_source->y_height == cpi->svc.source_last_TL0.y_height) {
    aom_yv12_copy_y(cpi->unscaled_source, &cpi->svc.source_last_TL0, 1);
    aom_yv12_copy_u(cpi->unscaled_source, &cpi->svc.source_last_TL0, 1);
    aom_yv12_copy_v(cpi->unscaled_source, &cpi->svc.source_last_TL0, 1);
  }

  return AOM_CODEC_OK;
}